

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O3

void api_suite::api_ctor_copy(void)

{
  circular_array<int,_4UL> copy;
  undefined8 local_88;
  undefined4 local_7c;
  undefined4 local_78 [4];
  undefined4 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_48 [4];
  undefined4 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_38 = local_48;
  local_28 = 5;
  local_30 = 1;
  local_48[0] = 0xb;
  local_68 = local_78;
  local_78[0] = 0xb;
  local_60 = 1;
  local_58 = 5;
  local_88 = 1;
  local_7c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x23,"void api_suite::api_ctor_copy()",&local_88,&local_7c);
  local_88 = 4;
  local_7c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x24,"void api_suite::api_ctor_copy()",&local_88,&local_7c);
  return;
}

Assistant:

void api_ctor_copy()
{
    circular_array<int, 4> data;
    data.push_back(11);
    circular_array<int, 4> copy(data);
    BOOST_TEST_EQ(copy.size(), 1);
    BOOST_TEST_EQ(copy.capacity(), 4);
}